

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O0

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this,string *name,cmake *cm)

{
  bool bVar1;
  cmGlobalGhsMultiGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  cmake *local_28;
  cmake *cm_local;
  string *name_local;
  cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this_local;
  
  local_28 = cm;
  cm_local = (cmake *)name;
  name_local = (string *)this;
  cmGlobalGhsMultiGenerator::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=(name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    this_local = (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *)0x0;
  }
  else {
    this_00 = (cmGlobalGhsMultiGenerator *)operator_new(0x640);
    cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(this_00,local_28);
    this_local = (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *)this_00;
  }
  return (cmGlobalGenerator *)this_local;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return nullptr;
    }
    return new T(cm);
  }